

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  pointer pcVar10;
  ostream *poVar11;
  char *pcVar12;
  long lVar13;
  char tempname [4096];
  string local_1088;
  int *local_1068;
  long local_1060;
  string local_1058;
  char local_1038 [4104];
  
  lVar13 = (long)gargp;
  local_1068 = running;
  if (*running == 0) {
    lVar7 = (long)gargp;
    pbVar3 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar10 = pbVar3[lVar7]._M_dataplus._M_p;
    local_1060 = lVar7;
    if (pcVar10[1] == this->m_optionFlag) {
      lVar8 = 2;
      lVar13 = 0;
      while( true ) {
        *position = (int)lVar8;
        cVar5 = pcVar10[lVar8];
        if ((cVar5 == '\0') || (cVar5 == '=')) break;
        local_1038[lVar8 + -2] = cVar5;
        lVar8 = lVar8 + 1;
        pcVar10 = pbVar3[lVar7]._M_dataplus._M_p;
        lVar13 = lVar13 + 0x100000000;
      }
      local_1038[lVar13 >> 0x20] = '\0';
      local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
      sVar6 = strlen(local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1088,local_1038,local_1038 + sVar6);
      cVar5 = getType(this,&local_1088);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
        operator_delete(local_1088._M_dataplus._M_p);
      }
      if (cVar5 == '\0') {
        this->m_optionsArgument = true;
        goto LAB_00119731;
      }
      if ((this->m_oargv).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_dataplus._M_p[*position] == '=') {
        if (cVar5 == 'b') {
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Error: boolean variable cannot have any options: ");
          pcVar12 = local_1038;
          goto LAB_00119765;
        }
        *position = *position + 1;
      }
      bVar4 = false;
      lVar13 = local_1060;
    }
    else {
      *position = 1;
      local_1038[0] = pcVar10[1];
      local_1038[1] = 0;
      local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
      sVar6 = strlen(local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1088,local_1038,local_1038 + sVar6);
      cVar5 = getType(this,&local_1088);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
        operator_delete(local_1088._M_dataplus._M_p);
      }
      if (cVar5 != 'b') goto LAB_0011957b;
      bVar4 = true;
      cVar5 = 'b';
      lVar13 = local_1060;
    }
  }
  else {
    iVar2 = *position;
    *position = iVar2 + 1;
    local_1038[0] =
         (this->m_oargv).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p[(long)iVar2 + 1];
    local_1038[1] = 0;
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    cVar5 = getType(this,&local_1088);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    if (cVar5 == 'b') {
      bVar4 = true;
      cVar5 = 'b';
    }
    else {
      *local_1068 = 0;
LAB_0011957b:
      *position = *position + 1;
      if (cVar5 == '\0') {
LAB_00119731:
        this->m_optionsArgument = true;
        *position = 0;
        return gargp + 1;
      }
      bVar4 = true;
    }
  }
  lVar7 = (long)*position;
  pcVar10 = (this->m_oargv).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p;
  if ((cVar5 == 'b') || (pcVar10[lVar7] != '\0')) {
    if (bVar4 && cVar5 == 'b') {
      if (pcVar10[lVar7 + 1] == '\0') {
LAB_00119664:
        if (pcVar10[lVar7 + 1] == '\0') {
          *local_1068 = 0;
        }
      }
      else {
        *local_1068 = 1;
      }
    }
    else if (cVar5 == 'b') goto LAB_00119664;
  }
  else {
    gargp = gargp + 1;
    *position = 0;
  }
  if (gargp < this->m_oargc) {
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    pcVar10 = (this->m_oargv).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[gargp]._M_dataplus._M_p;
    pcVar12 = pcVar10 + *position;
    paVar1 = &local_1058.field_2;
    local_1058._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar10 == (pointer)0x0) {
      pcVar9 = (char *)0x1;
    }
    else {
      sVar6 = strlen(pcVar12);
      pcVar9 = pcVar12 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,pcVar12,pcVar9);
    setModified(this,&local_1088,&local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != paVar1) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    return gargp + (uint)(*local_1068 == 0);
  }
  poVar11 = (ostream *)&std::cerr;
  pcVar12 = "Error: last option requires a parameter";
LAB_00119765:
  poVar11 = std::operator<<(poVar11,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
	int optionForm;
	char tempname[4096];
	char optionType = OPTION_TYPE_unknown;

	if (running) {
		optionForm = OPTION_FORM_continue;
	} else if (m_oargv[gargp][1] == getFlag()) {
		optionForm = OPTION_FORM_long;
	} else {
		optionForm = OPTION_FORM_short;
	}

	switch (optionForm) {
		case OPTION_FORM_continue:
			position++;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				running = 0;
				position++;
			}
			break;
		case OPTION_FORM_short:
			position = 1;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				position++;
			}
			break;
		case OPTION_FORM_long:
			position = 2;
			while (m_oargv[gargp][position] != '=' &&
					m_oargv[gargp][position] != '\0') {
				tempname[position-2] = m_oargv[gargp][position];
				position++;
			}
			tempname[position-2] = '\0';
			optionType = getType(tempname);
			if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
				m_optionsArgument = 1;
				break;
			}
			if (m_oargv[gargp][position] == '=') {
				if (optionType == OPTION_TYPE_boolean) {
					std::cerr << "Error: boolean variable cannot have any options: "
					     << tempname << std::endl;
					exit(1);
				}
				position++;
			}
			break;
	}

	if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
		m_optionsArgument = 1;
		gargp++;
		position = 0;
		return gargp;
	}

	if (m_oargv[gargp][position] == '\0' &&
			optionType != OPTION_TYPE_boolean) {
		gargp++;
		position = 0;
	}

	if ((optionForm != OPTION_FORM_long) && (optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] != '\0')) {
		running = 1;
	} else if ((optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] == '\0')) {
		running = 0;
	}

	if (gargp >= m_oargc) {
		std::cerr << "Error: last option requires a parameter" << std::endl;
		exit(1);
	}
	setModified(tempname, &m_oargv[gargp][position]);

	if (!running) {
		gargp++;
	}
	return gargp;
}